

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnFuncType
          (BinaryReaderObjdump *this,Index index,Index param_count,Type *param_types,
          Index result_count,Type *result_types)

{
  char *pcVar1;
  long lVar2;
  undefined4 in_register_00000034;
  ulong uVar3;
  
  if ((((this->super_BinaryReaderObjdumpBase).options_)->mode == Details) &&
     (((this->super_BinaryReaderObjdumpBase).print_details_ & 1U) != 0)) {
    printf(" - type[%u] (",CONCAT44(in_register_00000034,index));
    if (param_count != 0) {
      lVar2 = 0;
      do {
        if (lVar2 != 0) {
          printf(", ");
        }
        pcVar1 = Type::GetName((Type *)((long)&param_types->enum_ + lVar2));
        printf("%s",pcVar1);
        lVar2 = lVar2 + 4;
      } while ((ulong)param_count << 2 != lVar2);
    }
    printf(") -> ");
    if (result_count == 0) {
      printf("nil");
    }
    else if (result_count == 1) {
      pcVar1 = Type::GetName(result_types);
      printf("%s",pcVar1);
    }
    else {
      putchar(0x28);
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          printf(", ");
        }
        pcVar1 = Type::GetName(result_types);
        printf("%s",pcVar1);
        uVar3 = uVar3 + 1;
        result_types = result_types + 1;
      } while (result_count != uVar3);
      putchar(0x29);
    }
    putchar(10);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnFuncType(Index index,
                                       Index param_count,
                                       Type* param_types,
                                       Index result_count,
                                       Type* result_types) {
  if (!ShouldPrintDetails()) {
    return Result::Ok;
  }
  printf(" - type[%" PRIindex "] (", index);
  for (Index i = 0; i < param_count; i++) {
    if (i != 0) {
      printf(", ");
    }
    printf("%s", param_types[i].GetName());
  }
  printf(") -> ");
  switch (result_count) {
    case 0:
      printf("nil");
      break;
    case 1:
      printf("%s", result_types[0].GetName());
      break;
    default:
      printf("(");
      for (Index i = 0; i < result_count; i++) {
        if (i != 0) {
          printf(", ");
        }
        printf("%s", result_types[i].GetName());
      }
      printf(")");
      break;
  }
  printf("\n");
  return Result::Ok;
}